

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O2

uint __thiscall
capnp::compiler::NodeTranslator::StructLayout::Union::addNewPointerLocation(Union *this)

{
  uint *puVar1;
  uint local_c;
  
  local_c = (*this->parent->_vptr_StructOrGroup[2])();
  puVar1 = kj::Vector<unsigned_int>::add<unsigned_int>(&this->pointerLocations,&local_c);
  return *puVar1;
}

Assistant:

uint addNewPointerLocation() {
      // Add a whole new pointer location to the union with the given size.

      return pointerLocations.add(parent.addPointer());
    }